

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O3

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::GetDirectBufferForNBytesAndAdvance
          (EpsCopyOutputStream *this,int size,uint8_t **pp)

{
  uint uVar1;
  uint8_t *res;
  uint8_t *puVar2;
  uint8_t *ptr;
  uint8_t *puVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  
  if ((this->had_error_ == true) || (uVar1 = Flush(this,*pp), this->had_error_ == true)) {
    puVar6 = this->buffer_;
  }
  else {
    puVar2 = this->buffer_end_;
    uVar4 = uVar1 - size;
    if (size <= (int)uVar1) {
      puVar3 = puVar2 + size;
      puVar5 = (uint8_t *)0x0;
      puVar6 = puVar3 + ((ulong)uVar4 - 0x10);
      if ((int)uVar4 < 0x11) {
        puVar5 = puVar3;
        puVar6 = this->buffer_ + (int)uVar4;
      }
      this->end_ = puVar6;
      this->buffer_end_ = puVar5;
      puVar6 = this->buffer_;
      if (0x10 < (int)uVar4) {
        puVar6 = puVar3;
      }
      goto LAB_003673da;
    }
    puVar3 = puVar2;
    puVar5 = this->buffer_ + (int)uVar1;
    puVar6 = this->buffer_;
    if (0x10 < (int)uVar1) {
      puVar3 = (uint8_t *)0x0;
      puVar5 = puVar2 + ((ulong)uVar1 - 0x10);
      puVar6 = puVar2;
    }
    this->end_ = puVar5;
    this->buffer_end_ = puVar3;
  }
  puVar2 = (uint8_t *)0x0;
LAB_003673da:
  *pp = puVar6;
  return puVar2;
}

Assistant:

uint8_t* EpsCopyOutputStream::GetDirectBufferForNBytesAndAdvance(int size,
                                                               uint8_t** pp) {
  if (had_error_) {
    *pp = buffer_;
    return nullptr;
  }
  int s = Flush(*pp);
  if (had_error_) {
    *pp = buffer_;
    return nullptr;
  }
  if (s >= size) {
    auto res = buffer_end_;
    *pp = SetInitialBuffer(buffer_end_ + size, s - size);
    return res;
  } else {
    *pp = SetInitialBuffer(buffer_end_, s);
    return nullptr;
  }
}